

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FboCases::TexSubImageAfterRenderTest::render
          (TexSubImageAfterRenderTest *this,Context *context,Surface *dst)

{
  undefined8 uVar1;
  deUint32 program;
  uint uVar2;
  uint uVar3;
  FboConfig *pFVar4;
  void *pvVar5;
  Vector<float,_3> local_2d0;
  Vector<float,_3> local_2c4;
  PixelBufferAccess local_2b8;
  Vector<float,_3> local_28c;
  Vector<float,_3> local_280;
  uint local_274;
  deUint32 fboTex;
  uint local_244;
  deUint32 fourQuadsTex;
  TextureFormat local_218;
  undefined1 local_210 [8];
  TextureLevel metaballs;
  TextureFormat local_1c0;
  undefined1 local_1b8 [8];
  TextureLevel fourQuads;
  bool isRGBA;
  undefined1 local_178 [4];
  deUint32 shaderID;
  SingleTex2DShader shader;
  Surface *dst_local;
  Context *context_local;
  TexSubImageAfterRenderTest *this_local;
  
  shader.super_ShaderProgram._336_8_ = dst;
  SingleTex2DShader::SingleTex2DShader((SingleTex2DShader *)local_178);
  program = (*context->_vptr_Context[0x75])(context,(SingleTex2DShader *)local_178);
  pFVar4 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  fourQuads.m_data.m_cap._3_1_ = pFVar4->colorbufferFormat == 0x1908;
  tcu::TextureFormat::TextureFormat(&local_1c0,RGB,UNORM_INT8);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_1b8,&local_1c0,0x40,0x40,1);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&metaballs.m_data.m_cap,(TextureLevel *)local_1b8);
  tcu::fillWithRGBAQuads((PixelBufferAccess *)&metaballs.m_data.m_cap);
  tcu::TextureFormat::TextureFormat(&local_218,(fourQuads.m_data.m_cap._3_1_ & 1) + RGB,UNORM_INT8);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_210,&local_218,0x40,0x40,1);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&stack0xfffffffffffffdc0,(TextureLevel *)local_210);
  tcu::fillWithMetaballs((PixelBufferAccess *)&stack0xfffffffffffffdc0,5,3);
  SingleTex2DShader::setUnit((SingleTex2DShader *)local_178,context,program,0);
  local_244 = 1;
  (*context->_vptr_Context[6])(context,0xde1,1);
  (*context->_vptr_Context[0x1d])(context,0xde1,0x2801,0x2601);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&stack0xfffffffffffffd90,(TextureLevel *)local_1b8);
  pvVar5 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)&stack0xfffffffffffffd90);
  (*context->_vptr_Context[0x11])(context,0xde1,0,0x1907,0x40,0x40,0,0x1907,0x1401,pvVar5);
  (*context->_vptr_Context[9])(context,0x8d40,1);
  local_274 = 2;
  (*context->_vptr_Context[6])(context,0xde1,2);
  (*context->_vptr_Context[0x7e])
            (context,0xde1,0,(ulong)((fourQuads.m_data.m_cap._3_1_ & 1) + 0x1907),0x80);
  (*context->_vptr_Context[0x1d])(context,0xde1,0x2801,0x2601);
  (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0xde1,(ulong)local_274,0);
  (*context->_vptr_Context[5])(context,0,0,0x80);
  (*context->_vptr_Context[6])(context,0xde1,(ulong)local_244);
  tcu::Vector<float,_3>::Vector(&local_280,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_28c,1.0,1.0,0.0);
  sglr::drawQuad(context,program,&local_280,&local_28c);
  (*context->_vptr_Context[6])(context,0xde1,(ulong)local_274);
  uVar2 = (uint)fourQuads.m_data.m_cap._3_1_;
  tcu::TextureLevel::getAccess(&local_2b8,(TextureLevel *)local_210);
  pvVar5 = tcu::PixelBufferAccess::getDataPtr(&local_2b8);
  (*context->_vptr_Context[0x14])
            (context,0xde1,0,0x20,0x20,0x40,0x40,(uVar2 & 1) + 0x1907,0x1401,pvVar5);
  (*context->_vptr_Context[9])(context,0x8d40,0);
  uVar2 = (*context->_vptr_Context[2])();
  uVar3 = (*context->_vptr_Context[3])();
  (*context->_vptr_Context[5])(context,0,0,(ulong)uVar2,(ulong)uVar3);
  tcu::Vector<float,_3>::Vector(&local_2c4,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_2d0,1.0,1.0,0.0);
  sglr::drawQuad(context,program,&local_2c4,&local_2d0);
  uVar1 = shader.super_ShaderProgram._336_8_;
  uVar2 = (*context->_vptr_Context[2])();
  uVar3 = (*context->_vptr_Context[3])();
  (*context->_vptr_Context[0x80])(context,uVar1,0,0,(ulong)uVar2,(ulong)uVar3);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_210);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_1b8);
  SingleTex2DShader::~SingleTex2DShader((SingleTex2DShader *)local_178);
  return;
}

Assistant:

void TexSubImageAfterRenderTest::render (sglr::Context& context, Surface& dst)
{
	SingleTex2DShader	shader;
	deUint32			shaderID	= context.createProgram(&shader);
	bool				isRGBA		= getConfig().colorbufferFormat == GL_RGBA;

	tcu::TextureLevel fourQuads(tcu::TextureFormat(tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8), 64, 64);
	tcu::fillWithRGBAQuads(fourQuads.getAccess());

	tcu::TextureLevel metaballs(tcu::TextureFormat(isRGBA ? tcu::TextureFormat::RGBA : tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8), 64, 64);
	tcu::fillWithMetaballs(metaballs.getAccess(), 5, 3);

	shader.setUnit(context, shaderID, 0);

	deUint32 fourQuadsTex = 1;
	context.bindTexture(GL_TEXTURE_2D, fourQuadsTex);
	context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	context.texImage2D(GL_TEXTURE_2D, 0, GL_RGB, 64, 64, 0, GL_RGB, GL_UNSIGNED_BYTE, fourQuads.getAccess().getDataPtr());

	context.bindFramebuffer(GL_FRAMEBUFFER, 1);

	deUint32 fboTex = 2;
	context.bindTexture(GL_TEXTURE_2D, fboTex);
	context.texImage2D(GL_TEXTURE_2D, 0, isRGBA ? GL_RGBA : GL_RGB, 128, 128);
	context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, fboTex, 0);

	// Render to fbo
	context.viewport(0, 0, 128, 128);
	context.bindTexture(GL_TEXTURE_2D, fourQuadsTex);
	sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	// Update texture using TexSubImage2D
	context.bindTexture(GL_TEXTURE_2D, fboTex);
	context.texSubImage2D(GL_TEXTURE_2D, 0, 32, 32, 64, 64, isRGBA ? GL_RGBA : GL_RGB, GL_UNSIGNED_BYTE, metaballs.getAccess().getDataPtr());

	// Draw to screen
	context.bindFramebuffer(GL_FRAMEBUFFER, 0);
	context.viewport(0, 0, context.getWidth(), context.getHeight());
	sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
	context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
}